

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.cpp
# Opt level: O3

void __thiscall
ot::commissioner::ProxyClient::SendRequest
          (ProxyClient *this,Request *aRequest,ResponseHandler *aHandler,uint16_t aPeerAloc16,
          uint16_t aPeerPort)

{
  pointer pcVar1;
  pointer __dest;
  _func_void *p_Var2;
  size_t __n;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  _Any_data local_108;
  code *local_f8;
  Address local_e8;
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  Endpoint *pEStack_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  if ((this->mMeshLocalPrefix).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->mMeshLocalPrefix).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_e8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = *(pointer *)&aRequest->mHeader;
    local_e8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         *(undefined4 *)((aRequest->mHeader).mToken + 4);
    local_e8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this;
    std::
    _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
    ::_Rb_tree(&local_d0,&(aRequest->mOptions)._M_t);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_a0,&aRequest->mPayload);
    local_88 = local_78;
    pcVar1 = (aRequest->mRequestUri)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar1,pcVar1 + (aRequest->mRequestUri)._M_string_length);
    local_68 = *(undefined8 *)&aRequest->mSubType;
    pEStack_60 = aRequest->mEndpoint;
    std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::function
              ((function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)> *)
               &local_58,aHandler);
    local_38 = CONCAT22(aPeerPort,aPeerAloc16);
    local_128._M_unused._M_object = (void *)0x0;
    local_128._8_8_ = 0;
    local_118 = (code *)0x0;
    pcStack_110 = (code *)0x0;
    p_Var2 = (_func_void *)operator_new(0xb8);
    *(pointer *)p_Var2 =
         local_e8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)(p_Var2 + 8) =
         local_e8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    *(undefined4 *)(p_Var2 + 0x10) =
         local_e8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_;
    std::
    _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
    ::_Rb_tree((_Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
                *)(p_Var2 + 0x18),&local_d0);
    *(undefined8 *)(p_Var2 + 0x48) = 0;
    *(undefined8 *)(p_Var2 + 0x50) = 0;
    *(undefined8 *)(p_Var2 + 0x58) = 0;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var2 + 0x48),
               (long)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    __dest = (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var2 + 0x48))->
             _M_impl).super__Vector_impl_data._M_start;
    __n = (long)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    if (__n != 0) {
      memmove(__dest,local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,__n);
    }
    *(pointer *)(p_Var2 + 0x50) = __dest + __n;
    *(_func_void **)(p_Var2 + 0x60) = p_Var2 + 0x70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(p_Var2 + 0x60),local_88,local_88 + local_80);
    *(undefined8 *)(p_Var2 + 0x80) = local_68;
    *(Endpoint **)(p_Var2 + 0x88) = pEStack_60;
    *(undefined8 *)(p_Var2 + 0x90) = 0;
    *(undefined8 *)(p_Var2 + 0x98) = 0;
    *(undefined8 *)(p_Var2 + 0xa0) = 0;
    *(undefined8 *)(p_Var2 + 0xa8) = uStack_40;
    if (local_48 != (code *)0x0) {
      *(void **)(p_Var2 + 0x90) = local_58._M_unused._M_object;
      *(undefined8 *)(p_Var2 + 0x98) = local_58._8_8_;
      *(code **)(p_Var2 + 0xa0) = local_48;
      local_48 = (code *)0x0;
      uStack_40 = 0;
    }
    *(undefined4 *)(p_Var2 + 0xb0) = local_38;
    pcStack_110 = std::
                  _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/udp_proxy.cpp:110:30)>
                  ::_M_invoke;
    local_118 = std::
                _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/udp_proxy.cpp:110:30)>
                ::_M_manager;
    local_128._M_unused._0_8_ = (undefined8)p_Var2;
    FetchMeshLocalPrefix(this,(ErrorHandler *)&local_128);
    if (local_118 != (code *)0x0) {
      (*local_118)(&local_128,&local_128,__destroy_functor);
    }
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
    if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
    ::~_Rb_tree(&local_d0);
  }
  else {
    std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::function
              ((function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)> *)
               &local_108,aHandler);
    GetAnycastLocator(&local_e8,this,aPeerAloc16);
    SendRequest(this,aRequest,(ResponseHandler *)&local_108,&local_e8,aPeerPort);
    if (local_e8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.mBytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_f8 != (code *)0x0) {
      (*local_f8)(&local_108,&local_108,__destroy_functor);
    }
  }
  return;
}

Assistant:

void ProxyClient::SendRequest(const coap::Request  &aRequest,
                              coap::ResponseHandler aHandler,
                              uint16_t              aPeerAloc16,
                              uint16_t              aPeerPort)
{
    if (mMeshLocalPrefix.empty())
    {
        FetchMeshLocalPrefix([=](Error aError) {
            if (aError == ErrorCode::kNone)
            {
                SendRequest(aRequest, aHandler, GetAnycastLocator(aPeerAloc16), aPeerPort);
            }
            else
            {
                aHandler(nullptr, aError);
            }
        });
    }
    else
    {
        SendRequest(aRequest, aHandler, GetAnycastLocator(aPeerAloc16), aPeerPort);
    }
}